

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minion.c
# Opt level: O3

int lminion(void)

{
  permonst *ptr;
  int iVar1;
  
  iVar1 = 0x14;
  while( true ) {
    ptr = mkclass(&u.uz,'\x1b',0);
    if ((ptr != (permonst *)0x0) && ((ptr->mflags2 & 0x800) == 0)) break;
    iVar1 = iVar1 + -1;
    if (iVar1 == 0) {
      return -1;
    }
  }
  iVar1 = monsndx(ptr);
  return iVar1;
}

Assistant:

int lminion(void)
{
	int tryct;
	const struct permonst *ptr;

	for (tryct = 0; tryct < 20; tryct++) {
	    ptr = mkclass(&u.uz, S_ANGEL,0);
	    if (ptr && !is_lord(ptr))
		return monsndx(ptr);
	}

	return NON_PM;
}